

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O3

int parsePseudoAttribute
              (ENCODING *enc,char *ptr,char *end,char **namePtr,char **nameEndPtr,char **valPtr,
              char **nextTokPtr)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  char *pcVar5;
  bool bVar6;
  char buf [1];
  char local_61;
  char *local_60;
  char *local_58;
  char *local_50;
  char **local_48;
  char **local_40;
  char **local_38;
  
  if (ptr == end) {
    *namePtr = (char *)0x0;
    return 1;
  }
  local_60 = &local_61;
  local_58 = ptr;
  local_50 = end;
  local_48 = namePtr;
  local_40 = nameEndPtr;
  local_38 = valPtr;
  (*enc->utf8Convert)(enc,&local_58,end,&local_60,(char *)&local_60);
  uVar3 = 0xffffffff;
  if (local_60 != &local_61) {
    uVar3 = (ulong)(uint)(int)local_61;
  }
  if ((0x20 < (uint)uVar3) || ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0)) {
    *nextTokPtr = ptr;
    return 0;
  }
  do {
    ptr = ptr + enc->minBytesPerChar;
    local_60 = &local_61;
    local_58 = ptr;
    (*enc->utf8Convert)(enc,&local_58,local_50,&local_60,(char *)&local_60);
    pcVar5 = local_50;
    uVar3 = (ulong)(uint)(int)local_61;
    if (local_60 == &local_61) {
      uVar3 = 0xffffffff;
    }
  } while (((uint)uVar3 < 0x21) && ((0x100002600U >> (uVar3 & 0x3f) & 1) != 0));
  if (ptr == local_50) {
    *local_48 = (char *)0x0;
    return 1;
  }
  *local_48 = ptr;
  do {
    local_60 = &local_61;
    local_58 = ptr;
    (*enc->utf8Convert)(enc,&local_58,pcVar5,&local_60,(char *)&local_60);
    iVar1 = (int)local_61;
    if (local_60 == &local_61) {
      iVar1 = -1;
    }
    uVar3 = (ulong)(iVar1 + 1U);
    if (iVar1 + 1U < 0x3f) {
      if ((0x200004c00U >> (uVar3 & 0x3f) & 1) != 0) {
        *local_40 = ptr;
        goto LAB_004e333d;
      }
      if (uVar3 == 0) goto LAB_004e357b;
      if (uVar3 == 0x3e) break;
    }
    ptr = ptr + enc->minBytesPerChar;
  } while( true );
  *local_40 = ptr;
  goto LAB_004e33c9;
  while ((0x100002600U >> (uVar3 & 0x3f) & 1) != 0) {
LAB_004e333d:
    ptr = ptr + enc->minBytesPerChar;
    local_60 = &local_61;
    local_58 = ptr;
    (*enc->utf8Convert)(enc,&local_58,local_50,&local_60,(char *)&local_60);
    uVar3 = (ulong)(uint)(int)local_61;
    if (local_60 == &local_61) {
      uVar3 = 0xffffffff;
    }
    if (0x3d < (uint)uVar3) goto LAB_004e357b;
  }
  pcVar5 = local_50;
  if (uVar3 != 0x3d) goto LAB_004e357b;
LAB_004e33c9:
  if (ptr != *local_48) {
    ptr = ptr + enc->minBytesPerChar;
    local_60 = &local_61;
    local_58 = ptr;
    (*enc->utf8Convert)(enc,&local_58,pcVar5,&local_60,(char *)&local_60);
    bVar6 = local_60 == &local_61;
    while( true ) {
      uVar4 = (uint)local_61;
      if (bVar6) {
        uVar4 = 0xffffffff;
      }
      if (0x27 < uVar4) goto LAB_004e357b;
      if ((0x100002600U >> ((ulong)uVar4 & 0x3f) & 1) == 0) break;
      ptr = ptr + enc->minBytesPerChar;
      local_60 = &local_61;
      local_58 = ptr;
      (*enc->utf8Convert)(enc,&local_58,pcVar5,&local_60,(char *)&local_60);
      bVar6 = local_60 == &local_61;
    }
    if ((0x8400000000U >> ((ulong)uVar4 & 0x3f) & 1) != 0) {
      ptr = ptr + enc->minBytesPerChar;
      *local_38 = ptr;
      local_60 = &local_61;
      local_58 = ptr;
      (*enc->utf8Convert)(enc,&local_58,pcVar5,&local_60,(char *)&local_60);
      uVar2 = (uint)local_61;
      if (local_60 == &local_61) {
        uVar2 = 0xffffffff;
      }
      if (uVar2 != uVar4) {
        do {
          if (((uVar2 - 0x3a < 0xfffffff6) && ((uVar2 & 0xffffffdf) - 0x5b < 0xffffffe6)) &&
             ((0x32 < uVar2 - 0x2d ||
              ((0x4000000000003U >> ((ulong)(uVar2 - 0x2d) & 0x3f) & 1) == 0)))) goto LAB_004e357b;
          ptr = ptr + enc->minBytesPerChar;
          local_60 = &local_61;
          local_58 = ptr;
          (*enc->utf8Convert)(enc,&local_58,pcVar5,&local_60,(char *)&local_60);
          uVar2 = (uint)local_61;
          if (local_60 == &local_61) {
            uVar2 = 0xffffffff;
          }
        } while (uVar2 != uVar4);
      }
      *nextTokPtr = ptr + enc->minBytesPerChar;
      return 1;
    }
  }
LAB_004e357b:
  *nextTokPtr = ptr;
  return 0;
}

Assistant:

static
int parsePseudoAttribute(const ENCODING *enc,
                         const char *ptr,
                         const char *end,
                         const char **namePtr,
                         const char **nameEndPtr,
                         const char **valPtr,
                         const char **nextTokPtr)
{
  int c;
  char open;
  if (ptr == end) {
    *namePtr = 0;
    return 1;
  }
  if (!isSpace(toAscii(enc, ptr, end))) {
    *nextTokPtr = ptr;
    return 0;
  }
  do {
    ptr += enc->minBytesPerChar;
  } while (isSpace(toAscii(enc, ptr, end)));
  if (ptr == end) {
    *namePtr = 0;
    return 1;
  }
  *namePtr = ptr;
  for (;;) {
    c = toAscii(enc, ptr, end);
    if (c == -1) {
      *nextTokPtr = ptr;
      return 0;
    }
    if (c == ASCII_EQUALS) {
      *nameEndPtr = ptr;
      break;
    }
    if (isSpace(c)) {
      *nameEndPtr = ptr;
      do {
        ptr += enc->minBytesPerChar;
      } while (isSpace(c = toAscii(enc, ptr, end)));
      if (c != ASCII_EQUALS) {
        *nextTokPtr = ptr;
        return 0;
      }
      break;
    }
    ptr += enc->minBytesPerChar;
  }
  if (ptr == *namePtr) {
    *nextTokPtr = ptr;
    return 0;
  }
  ptr += enc->minBytesPerChar;
  c = toAscii(enc, ptr, end);
  while (isSpace(c)) {
    ptr += enc->minBytesPerChar;
    c = toAscii(enc, ptr, end);
  }
  if (c != ASCII_QUOT && c != ASCII_APOS) {
    *nextTokPtr = ptr;
    return 0;
  }
  open = c;
  ptr += enc->minBytesPerChar;
  *valPtr = ptr;
  for (;; ptr += enc->minBytesPerChar) {
    c = toAscii(enc, ptr, end);
    if (c == open)
      break;
    if (!(ASCII_a <= c && c <= ASCII_z)
        && !(ASCII_A <= c && c <= ASCII_Z)
        && !(ASCII_0 <= c && c <= ASCII_9)
        && c != ASCII_PERIOD
        && c != ASCII_MINUS
        && c != ASCII_UNDERSCORE) {
      *nextTokPtr = ptr;
      return 0;
    }
  }
  *nextTokPtr = ptr + enc->minBytesPerChar;
  return 1;
}